

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

void __thiscall KeyPair::KeyPair(KeyPair *this,CKey *key,uint256 *merkle_root)

{
  _Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false> _Var1;
  int iVar2;
  uint256 *puVar3;
  pointer *__ptr;
  long in_FS_OFFSET;
  uint256 tweak;
  uchar pubkey_bytes [32];
  secp256k1_xonly_pubkey pubkey;
  XOnlyPubKey local_c8;
  uint256 local_a8;
  uchar local_88 [4];
  uchar auStack_84 [4];
  uchar auStack_80 [4];
  uchar auStack_7c [4];
  uchar local_78 [4];
  uchar auStack_74 [4];
  uchar auStack_70 [4];
  uchar auStack_6c [4];
  secp256k1_xonly_pubkey local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_keypair)._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_96UL> *)0x0;
  MakeKeyPairData(this);
  _Var1._M_head_impl =
       (this->m_keypair)._M_t.
       super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
       .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl;
  iVar2 = secp256k1_keypair_create
                    (secp256k1_context_sign,(secp256k1_keypair *)_Var1._M_head_impl,
                     ((key->keydata)._M_t.
                      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl)
                     ->_M_elems);
  if (merkle_root != (uint256 *)0x0 && iVar2 != 0) {
    iVar2 = secp256k1_keypair_xonly_pub
                      (secp256k1_context_sign,&local_68,(int *)0x0,
                       (secp256k1_keypair *)_Var1._M_head_impl);
    if (iVar2 == 0) {
      __assert_fail("secp256k1_keypair_xonly_pub(secp256k1_context_sign, &pubkey, nullptr, keypair)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x1a2,"KeyPair::KeyPair(const CKey &, const uint256 *)");
    }
    iVar2 = secp256k1_xonly_pubkey_serialize(secp256k1_context_sign,local_88,&local_68);
    if (iVar2 == 0) {
      __assert_fail("secp256k1_xonly_pubkey_serialize(secp256k1_context_sign, pubkey_bytes, &pubkey)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                    ,0x1a3,"KeyPair::KeyPair(const CKey &, const uint256 *)");
    }
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = local_78[0];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = local_78[1];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = local_78[2];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = local_78[3];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = auStack_74[0];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = auStack_74[1];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = auStack_74[2];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = auStack_74[3];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = auStack_70[0];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = auStack_70[1];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = auStack_70[2];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = auStack_70[3];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = auStack_6c[0];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = auStack_6c[1];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = auStack_6c[2];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = auStack_6c[3];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = local_88[0];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = local_88[1];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = local_88[2];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = local_88[3];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = auStack_84[0];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = auStack_84[1];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = auStack_84[2];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = auStack_84[3];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = auStack_80[0];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = auStack_80[1];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = auStack_80[2];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = auStack_80[3];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = auStack_7c[0];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = auStack_7c[1];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = auStack_7c[2];
    local_c8.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = auStack_7c[3];
    puVar3 = (uint256 *)
             std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (merkle_root,merkle_root + 1);
    if (puVar3 == merkle_root + 1) {
      merkle_root = (uint256 *)0x0;
    }
    XOnlyPubKey::ComputeTapTweakHash(&local_a8,&local_c8,merkle_root);
    iVar2 = secp256k1_keypair_xonly_tweak_add
                      (secp256k1_context_static,(secp256k1_keypair *)_Var1._M_head_impl,
                       (uchar *)&local_a8);
  }
  if (iVar2 == 0) {
    _Var1._M_head_impl =
         (this->m_keypair)._M_t.
         super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
         .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl;
    (this->m_keypair)._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl =
         (array<unsigned_char,_96UL> *)0x0;
    if (_Var1._M_head_impl != (array<unsigned_char,_96UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_96UL>_> *)this,_Var1._M_head_impl);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

KeyPair::KeyPair(const CKey& key, const uint256* merkle_root)
{
    static_assert(std::tuple_size<KeyType>() == sizeof(secp256k1_keypair));
    MakeKeyPairData();
    auto keypair = reinterpret_cast<secp256k1_keypair*>(m_keypair->data());
    bool success = secp256k1_keypair_create(secp256k1_context_sign, keypair, UCharCast(key.data()));
    if (success && merkle_root) {
        secp256k1_xonly_pubkey pubkey;
        unsigned char pubkey_bytes[32];
        assert(secp256k1_keypair_xonly_pub(secp256k1_context_sign, &pubkey, nullptr, keypair));
        assert(secp256k1_xonly_pubkey_serialize(secp256k1_context_sign, pubkey_bytes, &pubkey));
        uint256 tweak = XOnlyPubKey(pubkey_bytes).ComputeTapTweakHash(merkle_root->IsNull() ? nullptr : merkle_root);
        success = secp256k1_keypair_xonly_tweak_add(secp256k1_context_static, keypair, tweak.data());
    }
    if (!success) ClearKeyPairData();
}